

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildLogicalOp(int nToken,CNscPStackEntry *pLhs,CNscPStackEntry *pRhs)

{
  bool bVar1;
  NscType NVar2;
  NscType NVar3;
  int iVar4;
  CNscContext *pCVar5;
  size_t nRhsSize;
  uchar *pauchRhs;
  CNscPStackEntry *in_RDX;
  CNscPStackEntry *in_RSI;
  int in_EDI;
  int nRhsConstant;
  int nLhsConstant;
  NscPCode nOp;
  char *pszOp;
  NscType nRhsType;
  NscType nLhsType;
  CNscPStackEntry *pOut;
  undefined4 in_stack_ffffffffffffff88;
  NscType in_stack_ffffffffffffff8c;
  CNscContext *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  CNscPStackEntry *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  char *pcVar9;
  NscPCode nCode;
  
  pCVar5 = (CNscContext *)
           CNscContext::GetPStackEntry
                     (in_stack_ffffffffffffff90,
                      (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
  bVar1 = CNscContext::IsPhase2(g_pCtx);
  if ((bVar1) || (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)) {
    if (in_RSI == (CNscPStackEntry *)0x0) {
      __assert_fail("pLhs",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                    ,0x107c,
                    "CNscPStackEntry *NscBuildLogicalOp(int, CNscPStackEntry *, CNscPStackEntry *)")
      ;
    }
    if (in_RDX == (CNscPStackEntry *)0x0) {
      __assert_fail("pRhs",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                    ,0x107d,
                    "CNscPStackEntry *NscBuildLogicalOp(int, CNscPStackEntry *, CNscPStackEntry *)")
      ;
    }
    NVar2 = CNscPStackEntry::GetType(in_RSI);
    NVar3 = CNscPStackEntry::GetType(in_RDX);
    if ((NVar2 == NscType_Error) || (NVar3 == NscType_Error)) {
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    }
    else {
      if (in_EDI == 0x118) {
        pcVar9 = "&&";
        uVar8 = 0xb;
      }
      else {
        if (in_EDI != 0x119) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                        ,0x10a0,
                        "CNscPStackEntry *NscBuildLogicalOp(int, CNscPStackEntry *, CNscPStackEntry *)"
                       );
        }
        pcVar9 = "||";
        uVar8 = 0xc;
      }
      if ((NVar2 == NscType_Integer) && (NVar3 == NscType_Integer)) {
        uVar7 = 0xffffffff;
        uVar6 = 0xffffffff;
        bVar1 = CNscContext::GetOptExpression(g_pCtx);
        nCode = (NscPCode)((ulong)pcVar9 >> 0x20);
        if (bVar1) {
          bVar1 = CNscPStackEntry::IsSimpleConstant((CNscPStackEntry *)0x204825);
          if (bVar1) {
            iVar4 = CNscPStackEntry::GetInteger((CNscPStackEntry *)in_stack_ffffffffffffff90);
            uVar7 = (uint)(iVar4 != 0);
          }
          bVar1 = CNscPStackEntry::IsSimpleConstant((CNscPStackEntry *)0x204852);
          if (bVar1) {
            iVar4 = CNscPStackEntry::GetInteger((CNscPStackEntry *)in_stack_ffffffffffffff90);
            uVar6 = (uint)(iVar4 != 0);
          }
        }
        if (uVar7 == 0xffffffff) {
          in_stack_ffffffffffffff90 = pCVar5;
          CNscPStackEntry::GetData(in_RSI);
          nRhsSize = CNscPStackEntry::GetDataSize(in_RSI);
          pauchRhs = CNscPStackEntry::GetData(in_RDX);
          CNscPStackEntry::GetDataSize(in_RDX);
          CNscPStackEntry::PushLogicalOp
                    ((CNscPStackEntry *)CONCAT44(NVar2,NVar3),nCode,(uchar *)CONCAT44(uVar8,uVar7),
                     CONCAT44(uVar6,in_stack_ffffffffffffffb8),pauchRhs,nRhsSize);
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        }
        else if ((in_EDI == 0x118) && (uVar7 == 0)) {
          CNscPStackEntry::PushConstantInteger(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        }
        else if ((in_EDI == 0x119) && (uVar7 == 1)) {
          CNscPStackEntry::PushConstantInteger(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        }
        else if (uVar6 == 0xffffffff) {
          CNscPStackEntry::AppendData
                    (in_stack_ffffffffffffffa0,
                     (CNscPStackEntry *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        }
        else {
          CNscPStackEntry::PushConstantInteger(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        }
      }
      else {
        CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorOperatorTypeMismatch,pcVar9);
        CNscPStackEntry::SetType
                  ((CNscPStackEntry *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      }
    }
    CNscContext::FreePStackEntry
              (in_stack_ffffffffffffff90,
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    CNscContext::FreePStackEntry
              (in_stack_ffffffffffffff90,
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  else {
    if (in_RSI != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_ffffffffffffff90,
                 (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    if (in_RDX != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                (in_stack_ffffffffffffff90,
                 (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    CNscPStackEntry::SetType((CNscPStackEntry *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c)
    ;
  }
  return (CNscPStackEntry *)pCVar5;
}

Assistant:

YYSTYPE NscBuildLogicalOp (int nToken, YYSTYPE pLhs, YYSTYPE pRhs)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pLhs)
			g_pCtx ->FreePStackEntry (pLhs);
		if (pRhs)
			g_pCtx ->FreePStackEntry (pRhs);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Check for an error
	//

	assert (pLhs);
	assert (pRhs);
	NscType nLhsType = pLhs ->GetType ();
	NscType nRhsType = pRhs ->GetType ();
	if (nLhsType == NscType_Error || nRhsType == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, we are good
	//

	else
	{

		//
		// Get operator information
		//

		const char *pszOp;
		NscPCode nOp;
		if (nToken == ANDAND)
		{
			pszOp = "&&";
			nOp = NscPCode_LogicalAND;
		}
		else if (nToken == OROR)
		{
			pszOp = "||";
			nOp = NscPCode_LogicalOR;
		}
		else
		{
			pszOp = "&&";
			nOp = NscPCode_LogicalAND;
			assert (false);
		}

		//
		// Process the operator
		//

		if (nLhsType == NscType_Integer && nRhsType == NscType_Integer)
		{

			//
			// Get the constant value of the left and right side
			//

			int nLhsConstant = -1;
			int nRhsConstant = -1;
			if (g_pCtx ->GetOptExpression ())
			{
				if (pLhs ->IsSimpleConstant ())
					nLhsConstant = pLhs ->GetInteger () != 0 ? 1 : 0;
				if (pRhs ->IsSimpleConstant ())
					nRhsConstant = pRhs ->GetInteger () != 0 ? 1 : 0;
			}

			//
			// If the left side is not constant
			//

			if (nLhsConstant == -1)
			{
				pOut ->PushLogicalOp (nOp, 
					pLhs ->GetData (), pLhs ->GetDataSize (),
					pRhs ->GetData (), pRhs ->GetDataSize ());
				pOut ->SetType (NscType_Integer);
			}

			//
			// If the operation is known to be true or false by the lhs
			//

			else if (nToken == ANDAND && nLhsConstant == 0)
			{
				pOut ->PushConstantInteger (0);
				pOut ->SetType (NscType_Integer);
			}
			else if (nToken == OROR && nLhsConstant == 1)
			{
				pOut ->PushConstantInteger (1);
				pOut ->SetType (NscType_Integer);
			}

			//
			// If the operation is known to be true or false by the rhs
			//

			else if (nRhsConstant != -1)
			{
				pOut ->PushConstantInteger (nRhsConstant);
				pOut ->SetType (NscType_Integer);
			}

			//
			// Otherwise, just use the rhs
			//

			else
			{
				pOut ->AppendData (pRhs);
				pOut ->SetType (NscType_Integer);
			}
		}
		else
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, pszOp);
			pOut ->SetType (NscType_Error);
		}
	}

	//
	// Rundown
	//

    g_pCtx ->FreePStackEntry (pLhs);
    g_pCtx ->FreePStackEntry (pRhs);
	return pOut;
}